

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::JsRTCodeParseAction_Emit
               (EventLogEntry *evt,FileWriter *writer,ThreadContext *threadContext)

{
  JsRTCodeParseAction *pJVar1;
  
  pJVar1 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTCodeParseAction,(TTD::NSLogEvents::EventKind)67>
                     (evt);
  (*writer->_vptr_FileWriter[3])(writer,0x12,1);
  NSSnapValues::EmitTTDVar(pJVar1->Result,writer,NoSeparator);
  FileWriter::WriteUInt64(writer,sourceContextId,pJVar1->SourceContextId,CommaSeparator);
  FileWriter::WriteTag<LoadScriptFlag>(writer,loadFlag,pJVar1->LoadFlag,CommaSeparator);
  FileWriter::WriteUInt32(writer,bodyCounterId,pJVar1->BodyCtrId,CommaSeparator);
  FileWriter::WriteString(writer,uri,&pJVar1->SourceUri,CommaSeparator);
  (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)pJVar1->IsUtf8,1);
  FileWriter::WriteLengthValue(writer,pJVar1->SourceByteLength,CommaSeparator);
  JsSupport::WriteCodeToFile
            (threadContext,true,pJVar1->BodyCtrId,pJVar1->IsUtf8,pJVar1->SourceCode,
             pJVar1->SourceByteLength);
  return;
}

Assistant:

void JsRTCodeParseAction_Emit(const EventLogEntry* evt, FileWriter* writer, ThreadContext* threadContext)
        {
            const JsRTCodeParseAction* cpAction = GetInlineEventDataAs<JsRTCodeParseAction, EventKind::CodeParseActionTag>(evt);

            writer->WriteKey(NSTokens::Key::argRetVal, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitTTDVar(cpAction->Result, writer, NSTokens::Separator::NoSeparator);

            writer->WriteUInt64(NSTokens::Key::sourceContextId, cpAction->SourceContextId, NSTokens::Separator::CommaSeparator);
            writer->WriteTag<LoadScriptFlag>(NSTokens::Key::loadFlag, cpAction->LoadFlag, NSTokens::Separator::CommaSeparator);

            writer->WriteUInt32(NSTokens::Key::bodyCounterId, cpAction->BodyCtrId, NSTokens::Separator::CommaSeparator);

            writer->WriteString(NSTokens::Key::uri, cpAction->SourceUri, NSTokens::Separator::CommaSeparator);

            writer->WriteBool(NSTokens::Key::boolVal, cpAction->IsUtf8, NSTokens::Separator::CommaSeparator);
            writer->WriteLengthValue(cpAction->SourceByteLength, NSTokens::Separator::CommaSeparator);

            JsSupport::WriteCodeToFile(threadContext, true, cpAction->BodyCtrId, cpAction->IsUtf8, cpAction->SourceCode, cpAction->SourceByteLength);
        }